

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::CommonFunctionCase::init(CommonFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  RenderContext *renderCtx;
  ShaderExecutor *pSVar2;
  TestLog *log;
  TestError *this_00;
  allocator<char> local_31;
  string local_30;
  CommonFunctionCase *local_10;
  CommonFunctionCase *this_local;
  
  local_10 = this;
  renderCtx = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  pSVar2 = deqp::gls::ShaderExecUtil::createExecutor(renderCtx,this->m_shaderType,&this->m_spec);
  this->m_executor = pSVar2;
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::ShaderExecUtil::operator<<(log,this->m_executor);
  uVar1 = (*this->m_executor->_vptr_ShaderExecutor[2])();
  if ((uVar1 & 1) == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Compile failed",&local_31);
    tcu::TestError::TestError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return uVar1;
}

Assistant:

void CommonFunctionCase::init (void)
{
	DE_ASSERT(!m_executor);

	m_executor = createExecutor(m_context.getRenderContext(), m_shaderType, m_spec);
	m_testCtx.getLog() << m_executor;

	if (!m_executor->isOk())
		throw tcu::TestError("Compile failed");
}